

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall IteratorTest::accessIteratorOperations<false>(IteratorTest *this)

{
  pointer puVar1;
  pointer puVar2;
  size_t j;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  Iterator<int,_false,_std::allocator<unsigned_long>_> *pIVar4;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar5;
  reference piVar6;
  reference piVar7;
  logic_error *plVar8;
  code *pcVar9;
  undefined *puVar10;
  long lVar11;
  size_t sVar12;
  Iterator<TestType,_false,_std::allocator<unsigned_long>_> it_3;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  Iterator<TestType,_false,_std::allocator<unsigned_long>_> local_188;
  undefined1 local_158 [8];
  pointer pTStack_150;
  size_t *local_148;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vStack_140;
  Iterator<TestType,_false,_std::allocator<unsigned_long>_> local_118;
  undefined1 local_e8 [16];
  size_t *local_d8;
  size_t local_c0;
  size_t local_b8;
  
  _Var3._M_current = (unsigned_long *)operator_new(8);
  *_Var3._M_current = 0x18;
  local_e8._0_8_ = this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_e8 + 8),_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_158);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
  vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148 = (size_t *)0x0;
  vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158 = (undefined1  [8])0x0;
  pTStack_150 = (pointer)0x0;
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_158);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)&local_188,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,0);
  local_148 = (size_t *)local_188.index_;
  local_158 = (undefined1  [8])local_188.view_;
  pTStack_150 = local_188.pointer_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&vStack_140,&local_188.coordinates_);
  if (local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar11 = 0;
  do {
    if ((local_158 == (undefined1  [8])0x0) ||
       ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <= local_148)) {
      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
      pcVar9 = std::runtime_error::~runtime_error;
      puVar10 = &std::runtime_error::typeinfo;
LAB_001bc749:
      __cxa_throw(plVar8,puVar10,pcVar9);
    }
    if ((int)pTStack_150->data_ != this->data_[lVar11]) {
      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar8,"test failed.");
      pcVar9 = std::logic_error::~logic_error;
      puVar10 = &std::logic_error::typeinfo;
      goto LAB_001bc749;
    }
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_158);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x18);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)&local_188,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,local_b8);
  if (local_158 == (undefined1  [8])0x0) {
    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
  }
  else {
    if ((undefined1  [8])local_188.view_ == local_158) {
      if (local_148 != (size_t *)local_188.index_) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        pcVar9 = std::logic_error::~logic_error;
        puVar10 = &std::logic_error::typeinfo;
        goto LAB_001bcad2;
      }
      if (local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_188.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_188.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pIVar4 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--
                         ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_158);
      if ((pIVar4->view_ == (view_pointer)0x0) ||
         ((pIVar4->view_->geometry_).size_ <= pIVar4->index_)) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
        pcVar9 = std::runtime_error::~runtime_error;
        puVar10 = &std::runtime_error::typeinfo;
LAB_001bcb04:
        __cxa_throw(plVar8,puVar10,pcVar9);
      }
      if (*pIVar4->pointer_ != 0x2e) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        pcVar9 = std::logic_error::~logic_error;
        puVar10 = &std::logic_error::typeinfo;
        goto LAB_001bcb04;
      }
      if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vStack_140.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_140.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      operator_delete(local_d8,local_c0 * 0x18);
      operator_delete(_Var3._M_current,8);
      _Var3._M_current = (unsigned_long *)operator_new(8);
      *_Var3._M_current = 0x18;
      local_e8._0_8_ = this;
      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Geometry<std::allocator<unsigned_long>> *)(local_e8 + 8),_Var3,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                 (allocator_type *)local_158);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
      vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_148 = (size_t *)0x0;
      vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_158 = (undefined1  [8])0x0;
      pTStack_150 = (pointer)0x0;
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_188,
                 (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,0);
      puVar2 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar1 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_158 = (undefined1  [8])local_188.view_;
      pTStack_150 = local_188.pointer_;
      local_148 = (size_t *)local_188.index_;
      vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
      vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1,(long)puVar2 - (long)puVar1);
      }
      if (local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_188.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_188.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      lVar11 = 0;
      do {
        if ((local_158 == (undefined1  [8])0x0) ||
           ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <= local_148)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          pcVar9 = std::runtime_error::~runtime_error;
          puVar10 = &std::runtime_error::typeinfo;
LAB_001bc77b:
          __cxa_throw(plVar8,puVar10,pcVar9);
        }
        if ((int)pTStack_150->data_ != this->data_[lVar11]) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar10 = &std::logic_error::typeinfo;
          goto LAB_001bc77b;
        }
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x18);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_188,
                 (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,local_b8);
      if (local_158 == (undefined1  [8])0x0) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
      }
      else {
        if ((undefined1  [8])local_188.view_ == local_158) {
          if (local_148 != (size_t *)local_188.index_) {
            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar8,"test failed.");
            pcVar9 = std::logic_error::~logic_error;
            puVar10 = &std::logic_error::typeinfo;
            goto LAB_001bcb80;
          }
          if (local_188.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_188.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_188.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_188.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          pIVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                             ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
          if ((pIVar5->view_ == (view_pointer)0x0) ||
             ((pIVar5->view_->geometry_).size_ <= pIVar5->index_)) {
            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
            pcVar9 = std::runtime_error::~runtime_error;
            puVar10 = &std::runtime_error::typeinfo;
LAB_001bcbb2:
            __cxa_throw(plVar8,puVar10,pcVar9);
          }
          if (*pIVar5->pointer_ != 0x2e) {
            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar8,"test failed.");
            pcVar9 = std::logic_error::~logic_error;
            puVar10 = &std::logic_error::typeinfo;
            goto LAB_001bcbb2;
          }
          if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(vStack_140.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)vStack_140.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)vStack_140.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          operator_delete(local_d8,local_c0 * 0x18);
          operator_delete(_Var3._M_current,8);
          _Var3._M_current = (unsigned_long *)operator_new(8);
          *_Var3._M_current = 0x18;
          local_e8._0_8_ = this;
          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Geometry<std::allocator<unsigned_long>> *)(local_e8 + 8),_Var3,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                     (allocator_type *)local_158);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
          vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_148 = (size_t *)0x0;
          vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_158 = (undefined1  [8])0x0;
          pTStack_150 = (pointer)0x0;
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                    ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)&local_118,
                     (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,0);
          local_188.view_ = local_118.view_;
          local_188.pointer_ = local_118.pointer_;
          local_188.index_ = local_118.index_;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_188.coordinates_,&local_118.coordinates_);
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_188);
          puVar2 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          puVar1 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_158 = (undefined1  [8])local_188.view_;
          pTStack_150 = local_188.pointer_;
          local_148 = (size_t *)local_188.index_;
          vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_188.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_188.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_188.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (puVar1 != (pointer)0x0) {
            operator_delete(puVar1,(long)puVar2 - (long)puVar1);
          }
          if (local_188.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_188.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_188.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_188.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_118.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_118.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_118.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar11 = 0;
          do {
            if ((local_158 == (undefined1  [8])0x0) ||
               ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <= local_148)) {
              plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
              pcVar9 = std::runtime_error::~runtime_error;
              puVar10 = &std::runtime_error::typeinfo;
LAB_001bc7ad:
              __cxa_throw(plVar8,puVar10,pcVar9);
            }
            if ((int)pTStack_150->data_ != this->data_[lVar11]) {
              plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar8,"test failed.");
              pcVar9 = std::logic_error::~logic_error;
              puVar10 = &std::logic_error::typeinfo;
              goto LAB_001bc7ad;
            }
            andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x18);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                    ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)&local_188,
                     (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,local_b8);
          if (local_158 == (undefined1  [8])0x0) {
            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          }
          else {
            if ((undefined1  [8])local_188.view_ == local_158) {
              if (local_148 != (size_t *)local_188.index_) {
                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar8,"test failed.");
                pcVar9 = std::logic_error::~logic_error;
                puVar10 = &std::logic_error::typeinfo;
                goto LAB_001bcc2e;
              }
              if (local_188.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_188.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              pIVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                                 ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
              if ((pIVar5->view_ == (view_pointer)0x0) ||
                 ((pIVar5->view_->geometry_).size_ <= pIVar5->index_)) {
                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
                pcVar9 = std::runtime_error::~runtime_error;
                puVar10 = &std::runtime_error::typeinfo;
LAB_001bcc60:
                __cxa_throw(plVar8,puVar10,pcVar9);
              }
              if (*pIVar5->pointer_ != 0x2e) {
                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar8,"test failed.");
                pcVar9 = std::logic_error::~logic_error;
                puVar10 = &std::logic_error::typeinfo;
                goto LAB_001bcc60;
              }
              if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(vStack_140.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)vStack_140.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)vStack_140.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete(local_d8,local_c0 * 0x18);
              operator_delete(_Var3._M_current,8);
              lVar11 = 0;
              do {
                *(long *)(local_e8 + lVar11 * 8) = lVar11;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 0x18);
              _Var3._M_current = (unsigned_long *)operator_new(8);
              *_Var3._M_current = 0x18;
              local_158 = (undefined1  [8])local_e8;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)&pTStack_150,_Var3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)&local_188);
              andres::View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_false,_std::allocator<unsigned_long>_> *)local_158);
              andres::View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_false,_std::allocator<unsigned_long>_> *)local_158);
              andres::Iterator<TestType,_false,_std::allocator<unsigned_long>_>::Iterator
                        (&local_188,
                         (View<TestType,_false,_std::allocator<unsigned_long>_> *)local_158,0);
              sVar12 = 0;
              do {
                if ((local_188.view_ == (view_pointer)0x0) ||
                   ((size_t *)((local_188.view_)->geometry_).size_ <= local_188.index_)) {
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
                  pcVar9 = std::runtime_error::~runtime_error;
                  puVar10 = &std::runtime_error::typeinfo;
LAB_001bc7df:
                  __cxa_throw(plVar8,puVar10,pcVar9);
                }
                if (sVar12 != (local_188.pointer_)->data_) {
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar8,"test failed.");
                  pcVar9 = std::logic_error::~logic_error;
                  puVar10 = &std::logic_error::typeinfo;
                  goto LAB_001bc7df;
                }
                andres::Iterator<TestType,_false,_std::allocator<unsigned_long>_>::operator++
                          (&local_188);
                sVar12 = sVar12 + 1;
              } while (sVar12 != 0x18);
              if (local_188.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_188.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete(local_148,
                              (long)vStack_140.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage * 0x18);
              operator_delete(_Var3._M_current,8);
              lVar11 = 0;
              do {
                *(long *)(local_e8 + lVar11 * 8) = lVar11;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 0x18);
              _Var3._M_current = (unsigned_long *)operator_new(8);
              *_Var3._M_current = 0x18;
              local_158 = (undefined1  [8])local_e8;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)&pTStack_150,_Var3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)&local_188);
              andres::View<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_true,_std::allocator<unsigned_long>_> *)local_158);
              andres::View<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_true,_std::allocator<unsigned_long>_> *)local_158);
              andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::Iterator
                        ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)&local_188,
                         (View<TestType,_true,_std::allocator<unsigned_long>_> *)local_158,0);
              sVar12 = 0;
              do {
                if ((local_188.view_ == (view_pointer)0x0) ||
                   ((size_t *)((local_188.view_)->geometry_).size_ <= local_188.index_)) {
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
                  pcVar9 = std::runtime_error::~runtime_error;
                  puVar10 = &std::runtime_error::typeinfo;
LAB_001bc811:
                  __cxa_throw(plVar8,puVar10,pcVar9);
                }
                if (sVar12 != (local_188.pointer_)->data_) {
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar8,"test failed.");
                  pcVar9 = std::logic_error::~logic_error;
                  puVar10 = &std::logic_error::typeinfo;
                  goto LAB_001bc811;
                }
                andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator++
                          ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)&local_188);
                sVar12 = sVar12 + 1;
              } while (sVar12 != 0x18);
              if (local_188.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_188.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete(local_148,
                              (long)vStack_140.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage * 0x18);
              operator_delete(_Var3._M_current,8);
              lVar11 = 0;
              do {
                *(long *)(local_e8 + lVar11 * 8) = lVar11;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 0x18);
              _Var3._M_current = (unsigned_long *)operator_new(8);
              *_Var3._M_current = 0x18;
              local_158 = (undefined1  [8])local_e8;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)&pTStack_150,_Var3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)&local_188);
              andres::View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_false,_std::allocator<unsigned_long>_> *)local_158);
              andres::View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_false,_std::allocator<unsigned_long>_> *)local_158);
              andres::Iterator<TestType,_false,_std::allocator<unsigned_long>_>::Iterator
                        (&local_118,
                         (View<TestType,_false,_std::allocator<unsigned_long>_> *)local_158,0);
              local_188.view_ = local_118.view_;
              local_188.pointer_ = local_118.pointer_;
              local_188.index_ = local_118.index_;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_188.coordinates_,&local_118.coordinates_);
              andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)&local_188);
              if (local_118.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_118.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_118.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_118.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              sVar12 = 0;
              do {
                if ((local_188.view_ == (view_pointer)0x0) ||
                   ((size_t *)((local_188.view_)->geometry_).size_ <= local_188.index_)) {
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
                  pcVar9 = std::runtime_error::~runtime_error;
                  puVar10 = &std::runtime_error::typeinfo;
LAB_001bc843:
                  __cxa_throw(plVar8,puVar10,pcVar9);
                }
                if (sVar12 != (local_188.pointer_)->data_) {
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar8,"test failed.");
                  pcVar9 = std::logic_error::~logic_error;
                  puVar10 = &std::logic_error::typeinfo;
                  goto LAB_001bc843;
                }
                andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator++
                          ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)&local_188);
                sVar12 = sVar12 + 1;
              } while (sVar12 != 0x18);
              if (local_188.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_188.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete(local_148,
                              (long)vStack_140.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage * 0x18);
              operator_delete(_Var3._M_current,8);
              _Var3._M_current = (unsigned_long *)operator_new(8);
              *_Var3._M_current = 0x18;
              local_e8._0_8_ = this;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)(local_e8 + 8),_Var3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)local_158);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
              vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_148 = (size_t *)0x0;
              vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_158 = (undefined1  [8])0x0;
              pTStack_150 = (pointer)0x0;
              andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_158);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
              andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                        ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)&local_188,
                         (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,0);
              local_148 = (size_t *)local_188.index_;
              local_158 = (undefined1  [8])local_188.view_;
              pTStack_150 = local_188.pointer_;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                        (&vStack_140,&local_188.coordinates_);
              if (local_188.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_188.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              lVar11 = 0;
              do {
                if ((local_158 == (undefined1  [8])0x0) ||
                   (((geometry_type *)((long)local_158 + 8))->size_ <=
                    (ulong)((long)local_148 + lVar11))) {
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
                  pcVar9 = std::runtime_error::~runtime_error;
                  puVar10 = &std::runtime_error::typeinfo;
LAB_001bc875:
                  __cxa_throw(plVar8,puVar10,pcVar9);
                }
                piVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                                   ((View<int,_false,_std::allocator<unsigned_long>_> *)local_158,
                                    (long)local_148 + lVar11);
                if (*piVar6 != this->data_[lVar11]) {
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar8,"test failed.");
                  pcVar9 = std::logic_error::~logic_error;
                  puVar10 = &std::logic_error::typeinfo;
                  goto LAB_001bc875;
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 != 0x18);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
              andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                        ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)&local_188,
                         (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,0);
              if (local_158 == (undefined1  [8])0x0) {
                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
              }
              else {
                if ((undefined1  [8])local_188.view_ == local_158) {
                  if (local_148 == (size_t *)local_188.index_) {
                    if (((geometry_type *)((long)local_158 + 8))->size_ <= (long)local_148 + 4U) {
                      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.")
                      ;
                      goto LAB_001bccc0;
                    }
                    piVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                                       ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                        local_158,(long)local_148 + 4U);
                    if (*piVar6 == this->data_[4]) {
                      if ((local_158 == (undefined1  [8])0x0) ||
                         ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <= local_148 + 2
                         )) {
                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar8,"Assertion failed.");
                        goto LAB_001bccc0;
                      }
                      piVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                                         ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                          local_158,(size_t)(local_148 + 2));
                      if (*piVar6 == this->data_[0x10]) {
                        if (local_188.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_188.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_188.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_188.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (vStack_140.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(vStack_140.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)vStack_140.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)vStack_140.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        operator_delete(local_d8,local_c0 * 0x18);
                        operator_delete(_Var3._M_current,8);
                        _Var3._M_current = (unsigned_long *)operator_new(8);
                        *_Var3._M_current = 0x18;
                        local_e8._0_8_ = this;
                        andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                        Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                  ((Geometry<std::allocator<unsigned_long>> *)(local_e8 + 8),_Var3,
                                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    )(_Var3._M_current + 1),&andres::defaultOrder,
                                   &andres::defaultOrder,(allocator_type *)local_158);
                        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
                        vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        local_148 = (size_t *)0x0;
                        vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        local_158 = (undefined1  [8])0x0;
                        pTStack_150 = (pointer)0x0;
                        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158)
                        ;
                        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
                        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_188
                                   ,(View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,0);
                        puVar2 = vStack_140.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage;
                        puVar1 = vStack_140.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                        local_158 = (undefined1  [8])local_188.view_;
                        pTStack_150 = local_188.pointer_;
                        local_148 = (size_t *)local_188.index_;
                        vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_start =
                             local_188.coordinates_.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                        vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_finish =
                             local_188.coordinates_.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                        vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage =
                             local_188.coordinates_.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                        local_188.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start = (pointer)0x0;
                        local_188.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish = (pointer)0x0;
                        local_188.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        if (puVar1 != (pointer)0x0) {
                          operator_delete(puVar1,(long)puVar2 - (long)puVar1);
                        }
                        if (local_188.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_188.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_188.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_188.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        lVar11 = 0;
                        do {
                          if ((local_158 == (undefined1  [8])0x0) ||
                             (((geometry_type *)((long)local_158 + 8))->size_ <=
                              (ulong)((long)local_148 + lVar11))) {
                            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar8,"Assertion failed.");
                            pcVar9 = std::runtime_error::~runtime_error;
                            puVar10 = &std::runtime_error::typeinfo;
LAB_001bc8a7:
                            __cxa_throw(plVar8,puVar10,pcVar9);
                          }
                          piVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                   operator()((View<int,_true,_std::allocator<unsigned_long>_> *)
                                              local_158,(long)local_148 + lVar11);
                          if (*piVar7 != this->data_[lVar11]) {
                            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar8,"test failed.");
                            pcVar9 = std::logic_error::~logic_error;
                            puVar10 = &std::logic_error::typeinfo;
                            goto LAB_001bc8a7;
                          }
                          lVar11 = lVar11 + 1;
                        } while (lVar11 != 0x18);
                        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
                        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_188
                                   ,(View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,0);
                        if (local_158 == (undefined1  [8])0x0) {
                          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar8,"Assertion failed.");
                        }
                        else {
                          if ((undefined1  [8])local_188.view_ == local_158) {
                            if (local_148 == (size_t *)local_188.index_) {
                              if (((geometry_type *)((long)local_158 + 8))->size_ <=
                                  (long)local_148 + 4U) {
                                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar8,"Assertion failed.");
                                goto LAB_001bcd2e;
                              }
                              piVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                       operator()((View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_158,(long)local_148 + 4U);
                              if (*piVar7 == this->data_[4]) {
                                if ((local_158 == (undefined1  [8])0x0) ||
                                   ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <=
                                    local_148 + 2)) {
                                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar8,"Assertion failed.");
                                  goto LAB_001bcd2e;
                                }
                                piVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                         operator()((View<int,_true,_std::allocator<unsigned_long>_>
                                                     *)local_158,(size_t)(local_148 + 2));
                                if (*piVar7 == this->data_[0x10]) {
                                  if (local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_188.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  if (vStack_140.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(vStack_140.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)vStack_140.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)vStack_140.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  operator_delete(local_d8,local_c0 * 0x18);
                                  operator_delete(_Var3._M_current,8);
                                  _Var3._M_current = (unsigned_long *)operator_new(8);
                                  *_Var3._M_current = 0x18;
                                  local_e8._0_8_ = this;
                                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            ((Geometry<std::allocator<unsigned_long>> *)
                                             (local_e8 + 8),_Var3,
                                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                              )(_Var3._M_current + 1),&andres::defaultOrder,
                                             &andres::defaultOrder,(allocator_type *)local_158);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_e8);
                                  vStack_140.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                  vStack_140.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                  local_148 = (size_t *)0x0;
                                  vStack_140.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                  local_158 = (undefined1  [8])0x0;
                                  pTStack_150 = (pointer)0x0;
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  testInvariant((Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                 *)local_158);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_e8);
                                  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                  Iterator((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                                           &local_118,
                                           (View<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_e8,0);
                                  local_188.view_ = local_118.view_;
                                  local_188.pointer_ = local_118.pointer_;
                                  local_188.index_ = local_118.index_;
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                            (&local_188.coordinates_,&local_118.coordinates_);
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  testInvariant((Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                 *)&local_188);
                                  puVar2 = vStack_140.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                  puVar1 = vStack_140.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                  local_158 = (undefined1  [8])local_188.view_;
                                  pTStack_150 = local_188.pointer_;
                                  local_148 = (size_t *)local_188.index_;
                                  vStack_140.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start =
                                       local_188.coordinates_.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                                  vStack_140.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish =
                                       local_188.coordinates_.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_finish;
                                  vStack_140.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage =
                                       local_188.coordinates_.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                  local_188.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                  local_188.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                  local_188.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                  if (puVar1 != (pointer)0x0) {
                                    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
                                  }
                                  if (local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_188.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  if (local_118.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_118.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_118.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_118.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  lVar11 = 0;
                                  do {
                                    if ((local_158 == (undefined1  [8])0x0) ||
                                       (((geometry_type *)((long)local_158 + 8))->size_ <=
                                        (ulong)((long)local_148 + lVar11))) {
                                      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::runtime_error::runtime_error
                                                ((runtime_error *)plVar8,"Assertion failed.");
                                      pcVar9 = std::runtime_error::~runtime_error;
                                      puVar10 = &std::runtime_error::typeinfo;
LAB_001bc8d9:
                                      __cxa_throw(plVar8,puVar10,pcVar9);
                                    }
                                    piVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>
                                             ::operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_158,(long)local_148 + lVar11);
                                    if (*piVar7 != this->data_[lVar11]) {
                                      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar8,"test failed.");
                                      pcVar9 = std::logic_error::~logic_error;
                                      puVar10 = &std::logic_error::typeinfo;
                                      goto LAB_001bc8d9;
                                    }
                                    lVar11 = lVar11 + 1;
                                  } while (lVar11 != 0x18);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_e8);
                                  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                  Iterator((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                                           &local_188,
                                           (View<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_e8,0);
                                  if (local_158 == (undefined1  [8])0x0) {
                                    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar8,"Assertion failed.");
                                  }
                                  else {
                                    if ((undefined1  [8])local_188.view_ == local_158) {
                                      if (local_148 == (size_t *)local_188.index_) {
                                        if (((geometry_type *)((long)local_158 + 8))->size_ <=
                                            (long)local_148 + 4U) {
                                          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error
                                                    ((runtime_error *)plVar8,"Assertion failed.");
                                          goto LAB_001bcd9c;
                                        }
                                        piVar7 = andres::
                                                 View<int,_true,_std::allocator<unsigned_long>_>::
                                                 operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_158,(long)local_148 + 4U);
                                        if (*piVar7 == this->data_[4]) {
                                          if ((local_158 == (undefined1  [8])0x0) ||
                                             ((size_t *)
                                              ((geometry_type *)((long)local_158 + 8))->size_ <=
                                              local_148 + 2)) {
                                            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar8,"Assertion failed.");
                                            goto LAB_001bcd9c;
                                          }
                                          piVar7 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_158,(size_t)(local_148 + 2));
                                          if (*piVar7 == this->data_[0x10]) {
                                            if (local_188.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0) {
                                              operator_delete(local_188.coordinates_.
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                            }
                                            if (vStack_140.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0) {
                                              operator_delete(vStack_140.
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)vStack_140.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)vStack_140.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                            }
                                            operator_delete(local_d8,local_c0 * 0x18);
                                            operator_delete(_Var3._M_current,8);
                                            return;
                                          }
                                        }
                                      }
                                      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar8,"test failed.");
                                      pcVar9 = std::logic_error::~logic_error;
                                      puVar10 = &std::logic_error::typeinfo;
                                      goto LAB_001bcdaa;
                                    }
                                    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar8,"Assertion failed.");
                                  }
LAB_001bcd9c:
                                  pcVar9 = std::runtime_error::~runtime_error;
                                  puVar10 = &std::runtime_error::typeinfo;
LAB_001bcdaa:
                                  __cxa_throw(plVar8,puVar10,pcVar9);
                                }
                              }
                            }
                            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar8,"test failed.");
                            pcVar9 = std::logic_error::~logic_error;
                            puVar10 = &std::logic_error::typeinfo;
                            goto LAB_001bcd3c;
                          }
                          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar8,"Assertion failed.");
                        }
LAB_001bcd2e:
                        pcVar9 = std::runtime_error::~runtime_error;
                        puVar10 = &std::runtime_error::typeinfo;
LAB_001bcd3c:
                        __cxa_throw(plVar8,puVar10,pcVar9);
                      }
                    }
                  }
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar8,"test failed.");
                  pcVar9 = std::logic_error::~logic_error;
                  puVar10 = &std::logic_error::typeinfo;
                  goto LAB_001bccce;
                }
                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
              }
LAB_001bccc0:
              pcVar9 = std::runtime_error::~runtime_error;
              puVar10 = &std::runtime_error::typeinfo;
LAB_001bccce:
              __cxa_throw(plVar8,puVar10,pcVar9);
            }
            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          }
          pcVar9 = std::runtime_error::~runtime_error;
          puVar10 = &std::runtime_error::typeinfo;
LAB_001bcc2e:
          __cxa_throw(plVar8,puVar10,pcVar9);
        }
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
      }
      pcVar9 = std::runtime_error::~runtime_error;
      puVar10 = &std::runtime_error::typeinfo;
LAB_001bcb80:
      __cxa_throw(plVar8,puVar10,pcVar9);
    }
    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
  }
  pcVar9 = std::runtime_error::~runtime_error;
  puVar10 = &std::runtime_error::typeinfo;
LAB_001bcad2:
  __cxa_throw(plVar8,puVar10,pcVar9);
}

Assistant:

void IteratorTest::accessIteratorOperations() {
    // operator*
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator->
    {
        TestType data[24];
        for(std::size_t j=0; j<24; ++j) {
            data[j].data_ = j;
        }
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<TestType, constTarget> v(shape.begin(),
            shape.end(), &data[0]);
        andres::Iterator<TestType, constTarget> it = v.begin();
        for(std::size_t j=0; j<24; ++j) {
            test(it->data_ == j);
            ++it;
        }
    }
    {
        TestType data[24];
        for(std::size_t j=0; j<24; ++j) {
            data[j].data_ = j;
        }
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<TestType, true> v(shape.begin(),
            shape.end(), &data[0]);
        andres::Iterator<TestType, true> it = v.begin();
        for(std::size_t j=0; j<24; ++j) {
            test(it->data_ == j);
            ++it;
        }
    }
    {
        TestType data[24];
        for(std::size_t j=0; j<24; ++j) {
            data[j].data_ = j;
        }
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<TestType, false> v(shape.begin(),
            shape.end(), &data[0]);
        andres::Iterator<TestType, true> it = v.begin();
        for(std::size_t j=0; j<24; ++j) {
            test(it->data_ == j);
            ++it;
        }
    }
    // operator[]
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it[i] == data_[i]);
        }
        test(it == v.begin() &&
               it[4] == data_[4] &&
               it[16] == data_[16]);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it[i] == data_[i]);
        }
        test(it == v.begin() &&
               it[4] == data_[4] &&
               it[16] == data_[16]);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it[i] == data_[i]);
        }
        test(it == v.begin() &&
               it[4] == data_[4] &&
               it[16] == data_[16]);
    }
}